

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrackJamTargetIdentifier.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::TrackJamTargetIdentifier::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,TrackJamTargetIdentifier *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  TrackJamTargetIdentifier *local_18;
  TrackJamTargetIdentifier *this_local;
  
  local_18 = this;
  this_local = (TrackJamTargetIdentifier *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Site:        ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(this->super_EntityIdentifier).super_SimulationIdentifier.m_ui16SiteID)
  ;
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Application: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(this->super_EntityIdentifier).super_SimulationIdentifier.
                             m_ui16ApplicationID);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Entity:      ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,*(ushort *)
                              &(this->super_EntityIdentifier).super_SimulationIdentifier.field_0xc);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Emitter ID:  ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(ushort)(byte)(this->super_EntityIdentifier).super_SimulationIdentifier
                                           .field_0xe);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Beam ID:     ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(ushort)(byte)(this->super_EntityIdentifier).super_SimulationIdentifier
                                           .field_0xf);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString TrackJamTargetIdentifier::GetAsString() const
{
    KStringStream ss;

    ss << "Site:        " << m_ui16SiteID              << "\n"
       << "Application: " << m_ui16ApplicationID       << "\n"
       << "Entity:      " << m_ui16EntityID            << "\n"
       << "Emitter ID:  " << ( KUINT16 )m_ui8EmitterID << "\n"
       << "Beam ID:     " << ( KUINT16 )m_ui8BeamID    << "\n";

    return ss.str();
}